

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>::on_num
          (int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned_int>
           *this)

{
  char *pcVar1;
  char cVar2;
  ushort uVar3;
  basic_format_specs<char> *pbVar4;
  bool bVar5;
  bool bVar6;
  char cVar7;
  uint uVar8;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar9;
  uint uVar10;
  int iVar11;
  char *pcVar12;
  uint uVar13;
  uint uVar14;
  _Alloc_hider _Var15;
  ulong uVar16;
  uint uVar17;
  int iVar18;
  size_type sVar19;
  char *pcVar20;
  ulong uVar21;
  uint uVar22;
  ulong size;
  string groups;
  char digits [40];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> buffer;
  string local_298;
  char local_278 [48];
  basic_memory_buffer<char,_500UL,_std::allocator<char>_> local_248;
  
  grouping_impl<char>(&local_298,(locale_ref)(this->locale).locale_);
  if (local_298._M_string_length == 0) {
    on_dec(this);
    goto LAB_00488c07;
  }
  cVar7 = thousands_sep_impl<char>((locale_ref)(this->locale).locale_);
  if (cVar7 == '\0') {
    on_dec(this);
    goto LAB_00488c07;
  }
  uVar14 = this->abs_value;
  uVar13 = 0x1f;
  if ((uVar14 | 1) != 0) {
    for (; (uVar14 | 1) >> uVar13 == 0; uVar13 = uVar13 - 1) {
    }
  }
  uVar3 = *(ushort *)(bsr2log10(int)::data + (ulong)uVar13 * 2);
  bVar6 = uVar14 < *(uint *)(basic_data<void>::zero_or_powers_of_10_32_new + (ulong)uVar3 * 4);
  uVar22 = (uint)uVar3 - (uint)bVar6;
  _Var15._M_p = local_298._M_dataplus._M_p;
  uVar13 = uVar22;
  uVar8 = uVar22;
  if (local_298._M_string_length == 0) {
LAB_00488a11:
    uVar17 = uVar8;
    uVar10 = uVar13;
    if (_Var15._M_p == local_298._M_dataplus._M_p + local_298._M_string_length) goto LAB_00488a1c;
  }
  else {
    uVar17 = (int)local_298._M_string_length + uVar22;
    sVar19 = local_298._M_string_length;
    do {
      cVar2 = *_Var15._M_p;
      uVar10 = uVar13 - (int)cVar2;
      if ((uVar10 == 0 || (int)uVar13 < (int)cVar2) || ((byte)(cVar2 + 0x81U) < 0x82))
      goto LAB_00488a11;
      uVar8 = uVar8 + 1;
      _Var15._M_p = _Var15._M_p + 1;
      sVar19 = sVar19 - 1;
      uVar13 = uVar10;
    } while (sVar19 != 0);
LAB_00488a1c:
    uVar17 = (int)(uVar10 - 1) / (int)(local_298._M_dataplus._M_p + local_298._M_string_length)[-1]
             + uVar17;
  }
  pcVar12 = local_278 + (int)uVar22;
  uVar13 = uVar14;
  if (99 < uVar14) {
    do {
      uVar14 = uVar13 / 100;
      *(undefined2 *)(pcVar12 + -2) =
           *(undefined2 *)(basic_data<void>::digits + (ulong)(uVar13 % 100) * 2);
      pcVar12 = pcVar12 + -2;
      bVar5 = 9999 < uVar13;
      uVar13 = uVar13 / 100;
    } while (bVar5);
  }
  if (uVar14 < 10) {
    pcVar12[-1] = (byte)uVar14 | 0x30;
  }
  else {
    *(undefined2 *)(pcVar12 + -2) = *(undefined2 *)(basic_data<void>::digits + (ulong)uVar14 * 2);
  }
  local_248.super_buffer<char>.size_ = 0;
  local_248.super_buffer<char>._vptr_buffer = (_func_int **)&PTR_grow_00691a88;
  local_248.super_buffer<char>.ptr_ = local_248.store_;
  local_248.super_buffer<char>.capacity_ = 500;
  uVar17 = uVar17 + this->prefix_size;
  if (-1 < (int)uVar17) {
    size = (ulong)uVar17;
    if (500 < uVar17) {
      basic_memory_buffer<char,_500UL,_std::allocator<char>_>::grow(&local_248,size);
    }
    pcVar12 = local_248.super_buffer<char>.ptr_;
    local_248.super_buffer<char>.size_ = local_248.super_buffer<char>.capacity_;
    if (size <= local_248.super_buffer<char>.capacity_) {
      local_248.super_buffer<char>.size_ = size;
    }
    pcVar20 = local_248.super_buffer<char>.ptr_ + (size - 1);
    if (1 < (int)uVar22) {
      uVar16 = (ulong)uVar22;
      iVar18 = ((uint)uVar3 - (uint)bVar6) + 1;
      iVar11 = 0;
      _Var15._M_p = local_298._M_dataplus._M_p;
      do {
        uVar16 = uVar16 - 1;
        pcVar1 = pcVar20 + -1;
        *pcVar20 = local_278[uVar16 & 0xffffffff];
        cVar2 = *_Var15._M_p;
        if ('\0' < cVar2) {
          iVar11 = iVar11 + 1;
          if ((cVar2 != '\x7f') && (iVar11 % (int)cVar2 == 0)) {
            if (_Var15._M_p + 1 != local_298._M_dataplus._M_p + local_298._M_string_length) {
              iVar11 = 0;
              _Var15._M_p = _Var15._M_p + 1;
            }
            pcVar20[-1] = cVar7;
            pcVar1 = pcVar20 + -2;
          }
        }
        pcVar20 = pcVar1;
        iVar18 = iVar18 + -1;
      } while (2 < iVar18);
    }
    *pcVar20 = local_278[0];
    if (this->prefix_size != 0) {
      pcVar20[-1] = '-';
    }
    pbVar4 = this->specs;
    uVar16 = (ulong)pbVar4->width;
    if (-1 < (long)uVar16) {
      uVar21 = 0;
      if (size <= uVar16) {
        uVar21 = uVar16 - size;
      }
      uVar16 = uVar21 >> (*(byte *)((long)&basic_data<void>::right_padding_shifts +
                                   (ulong)((byte)pbVar4->field_0x9 & 0xf)) & 0x3f);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        ((this->out).container,uVar16,&pbVar4->fill);
      bVar9 = std::__copy_move<false,false,std::random_access_iterator_tag>::
              __copy_m<char*,std::back_insert_iterator<fmt::v7::detail::buffer<char>>>
                        (pcVar12,pcVar12 + size,bVar9);
      bVar9 = fill<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>
                        (bVar9,uVar21 - uVar16,&pbVar4->fill);
      (this->out).container = bVar9.container;
      if (local_248.super_buffer<char>.ptr_ != local_248.store_) {
        operator_delete(local_248.super_buffer<char>.ptr_);
      }
LAB_00488c07:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p);
      }
      return;
    }
  }
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd-core/src/include/fmt/core.h"
              ,0x146,"negative value");
}

Assistant:

void on_num() {
    std::string groups = grouping<Char>(locale);
    if (groups.empty()) return on_dec();
    auto sep = thousands_sep<Char>(locale);
    if (!sep) return on_dec();
    int num_digits = count_digits(abs_value);
    int size = num_digits, n = num_digits;
    std::string::const_iterator group = groups.cbegin();
    while (group != groups.cend() && n > *group && *group > 0 &&
           *group != max_value<char>()) {
      size += sep_size;
      n -= *group;
      ++group;
    }
    if (group == groups.cend()) size += sep_size * ((n - 1) / groups.back());
    char digits[40];
    format_decimal(digits, abs_value, num_digits);
    basic_memory_buffer<Char> buffer;
    size += static_cast<int>(prefix_size);
    const auto usize = to_unsigned(size);
    buffer.resize(usize);
    basic_string_view<Char> s(&sep, sep_size);
    // Index of a decimal digit with the least significant digit having index 0.
    int digit_index = 0;
    group = groups.cbegin();
    auto p = buffer.data() + size - 1;
    for (int i = num_digits - 1; i > 0; --i) {
      *p-- = static_cast<Char>(digits[i]);
      if (*group <= 0 || ++digit_index % *group != 0 ||
          *group == max_value<char>())
        continue;
      if (group + 1 != groups.cend()) {
        digit_index = 0;
        ++group;
      }
      std::uninitialized_copy(s.data(), s.data() + s.size(),
                              make_checked(p, s.size()));
      p -= s.size();
    }
    *p-- = static_cast<Char>(*digits);
    if (prefix_size != 0) *p = static_cast<Char>('-');
    auto data = buffer.data();
    out = write_padded<align::right>(
        out, specs, usize, usize,
        [=](iterator it) { return copy_str<Char>(data, data + size, it); });
  }